

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSol_SPBCGSSetMaxl(SUNLinearSolver S,int maxl)

{
  SUNContext_conflict sunctx_local_scope_;
  int maxl_local;
  SUNLinearSolver S_local;
  
  maxl_local = maxl;
  if (maxl < 1) {
    maxl_local = 5;
  }
  *(int *)S->content = maxl_local;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_SPBCGSSetMaxl(SUNLinearSolver S, int maxl)
{
  SUNFunctionBegin(S->sunctx);

  /* Check for legal pretype */
  if (maxl <= 0) { maxl = SUNSPBCGS_MAXL_DEFAULT; }

  /* Set pretype */
  SPBCGS_CONTENT(S)->maxl = maxl;
  return SUN_SUCCESS;
}